

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

int SUNLinSol_SPBCGSSetPrecType(SUNLinearSolver S,int pretype)

{
  int pretype_local;
  SUNLinearSolver S_local;
  
  if ((((pretype == 0) || (pretype == 1)) || (pretype == 2)) || (pretype == 3)) {
    if (S == (SUNLinearSolver)0x0) {
      S_local._4_4_ = -1;
    }
    else {
      *(int *)((long)S->content + 4) = pretype;
      S_local._4_4_ = 0;
    }
  }
  else {
    S_local._4_4_ = -2;
  }
  return S_local._4_4_;
}

Assistant:

SUNDIALS_EXPORT int SUNLinSol_SPBCGSSetPrecType(SUNLinearSolver S, int pretype) 
{
  /* Check for legal pretype */ 
  if ((pretype != PREC_NONE)  && (pretype != PREC_LEFT) &&
      (pretype != PREC_RIGHT) && (pretype != PREC_BOTH)) {
    return(SUNLS_ILL_INPUT);
  }

  /* Check for non-NULL SUNLinearSolver */
  if (S == NULL) return(SUNLS_MEM_NULL);

  /* Set pretype */
  PRETYPE(S) = pretype;
  return(SUNLS_SUCCESS);
}